

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::FramebufferCreateInfo::FramebufferCreateInfo
          (FramebufferCreateInfo *this,VkRenderPass _renderPass,
          vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
          *atachments,deUint32 _width,deUint32 _height,deUint32 _layers)

{
  size_type sVar1;
  const_reference pvVar2;
  deUint32 _layers_local;
  deUint32 _height_local;
  deUint32 _width_local;
  vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
  *atachments_local;
  FramebufferCreateInfo *this_local;
  VkRenderPass _renderPass_local;
  
  ::vk::VkFramebufferCreateInfo::VkFramebufferCreateInfo(&this->super_VkFramebufferCreateInfo);
  (this->super_VkFramebufferCreateInfo).sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  (this->super_VkFramebufferCreateInfo).pNext = (void *)0x0;
  (this->super_VkFramebufferCreateInfo).flags = 0;
  (this->super_VkFramebufferCreateInfo).renderPass.m_internal = _renderPass.m_internal;
  sVar1 = std::
          vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>::
          size(atachments);
  (this->super_VkFramebufferCreateInfo).attachmentCount = (deUint32)sVar1;
  if ((this->super_VkFramebufferCreateInfo).attachmentCount != 0) {
    pvVar2 = std::
             vector<vk::Handle<(vk::HandleType)13>,_std::allocator<vk::Handle<(vk::HandleType)13>_>_>
             ::operator[](atachments,0);
    (this->super_VkFramebufferCreateInfo).pAttachments = pvVar2;
  }
  (this->super_VkFramebufferCreateInfo).width = _width;
  (this->super_VkFramebufferCreateInfo).height = _height;
  (this->super_VkFramebufferCreateInfo).layers = _layers;
  return;
}

Assistant:

FramebufferCreateInfo::FramebufferCreateInfo (vk::VkRenderPass						_renderPass,
											  const std::vector<vk::VkImageView>&	atachments,
											  deUint32								_width,
											  deUint32								_height,
											  deUint32								_layers)
{
	sType = vk::VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
	pNext = DE_NULL;
	flags = 0u;

	renderPass		= _renderPass;
	attachmentCount	= static_cast<deUint32>(atachments.size());

	if (attachmentCount)
	{
		pAttachments = const_cast<vk::VkImageView *>(&atachments[0]);
	}

	width	= _width;
	height	= _height;
	layers	= _layers;
}